

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O3

size_t sum_count_dfs(log_multi *b,node *node)

{
  uint32_t *puVar1;
  node *pnVar2;
  size_t sVar3;
  long lVar4;
  
  if (node->internal == true) {
    pnVar2 = (b->nodes)._begin;
    lVar4 = 0;
    do {
      sVar3 = sum_count_dfs(b,pnVar2 + node->left);
      puVar1 = &node->right;
      node = pnVar2 + *puVar1;
      lVar4 = lVar4 + sVar3;
    } while (pnVar2[*puVar1].internal != false);
  }
  else {
    lVar4 = 0;
  }
  return (ulong)node->min_count + lVar4;
}

Assistant:

size_t sum_count_dfs(log_multi& b, const node& node)
{
  if (node.internal)
    return sum_count_dfs(b, b.nodes[node.left]) + sum_count_dfs(b, b.nodes[node.right]);
  else
    return node.min_count;
}